

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O1

UINT8 device_start_ay8910_emu(AY8910_CFG *cfg,DEV_INFO *retDevInf)

{
  byte bVar1;
  uint c;
  EPSG *psg;
  uint32_t (*pauVar2) [32];
  UINT32 r;
  byte bVar3;
  UINT8 UVar4;
  
  bVar1 = cfg->chipType;
  bVar3 = cfg->chipFlags & 0xef;
  if (0xf < bVar1) {
    bVar3 = cfg->chipFlags;
  }
  c = (cfg->_genCfg).clock;
  r = c >> (4U - ((bVar3 & 0x10) == 0) & 0x1f);
  UVar4 = (cfg->_genCfg).srMode;
  if ((UVar4 == '\x01') || ((UVar4 == '\x02' && (r < (cfg->_genCfg).smplRate)))) {
    r = (cfg->_genCfg).smplRate;
  }
  psg = EPSG_new(c,r);
  if (psg == (EPSG *)0x0) {
    UVar4 = 0xff;
  }
  else {
    UVar4 = '\0';
    psg->quality = 0;
    internal_refresh(psg);
    pauVar2 = voltbl + 1;
    if (0xf < bVar1) {
      pauVar2 = voltbl;
    }
    psg->voltbl = *pauVar2;
    psg->chp_flags = bVar3;
    internal_refresh(psg);
    bVar1 = psg->chp_flags;
    psg->stereo_mask[0] = (byte)~bVar1 >> 6 | 1;
    *(uint8_t *)((long)psg->stereo_mask + 1) = '\x03';
    *(byte *)((long)psg->stereo_mask + 2) = (byte)~bVar1 >> 7 | 2;
    psg->_devData = (DEV_DATA)psg;
    retDevInf->dataPtr = &psg->_devData;
    retDevInf->sampleRate = r;
    retDevInf->devDef = &devDef_YM2149_Emu;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar4;
}

Assistant:

static UINT8 device_start_ay8910_emu(const AY8910_CFG* cfg, DEV_INFO* retDevInf)
{
	EPSG* chip;
	UINT8 isYM;
	UINT8 flags;
	UINT32 clock;
	UINT32 rate;
	
	clock = cfg->_genCfg.clock;
	isYM = ((cfg->chipType & 0xF0) > 0x00);
	flags = cfg->chipFlags;
	if (! isYM)
		flags &= ~YM2149_PIN26_LOW;
	
	if (flags & YM2149_PIN26_LOW)
		rate = clock / 2 / 8;
	else
		rate = clock / 8;
	SRATE_CUSTOM_HIGHEST(cfg->_genCfg.srMode, rate, cfg->_genCfg.smplRate);
	
	chip = EPSG_new(clock, rate);
	if (chip == NULL)
		return 0xFF;
	EPSG_set_quality(chip, 0);	// disable internal sample rate converter
	EPSG_setVolumeMode(chip, isYM ? 1 : 2);
	EPSG_setFlags(chip, flags);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, rate, &devDef_YM2149_Emu);
	return 0x00;
}